

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O3

void __thiscall DyndepParserTestNoImplicit::Run(DyndepParserTestNoImplicit *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  Edge *pEVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  
  iVar2 = g_current_test->assertion_failures_;
  DyndepParserTest::AssertParse
            (&this->super_DyndepParserTest,"ninja_dyndep_version = 1\nbuild out: dyndep\n");
  if (iVar2 == g_current_test->assertion_failures_) {
    testing::Test::Check
              (g_current_test,
               (this->super_DyndepParserTest).dyndep_file_.
               super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_node_count == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
               ,0x16a,"1u == dyndep_file_.size()");
    p_Var5 = *(_Base_ptr *)
              ((long)&(this->super_DyndepParserTest).dyndep_file_.
                      super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var1 = &(this->super_DyndepParserTest).dyndep_file_.
              super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    if (p_Var5 != (_Base_ptr)0x0) {
      pEVar3 = *(this->super_DyndepParserTest).state_.edges_.
                super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
                _M_start;
      p_Var6 = &p_Var1->_M_header;
      do {
        if (*(Edge **)(p_Var5 + 1) >= pEVar3) {
          p_Var6 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(Edge **)(p_Var5 + 1) < pEVar3];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var7 = p_Var6, pEVar3 < *(Edge **)(p_Var6 + 1))) {
        p_Var7 = &p_Var1->_M_header;
      }
    }
    bVar4 = testing::Test::Check
                      (g_current_test,(_Rb_tree_header *)p_Var7 != p_Var1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                       ,0x16c,"i != dyndep_file_.end()");
    if (bVar4) {
      testing::Test::Check
                (g_current_test,*(char *)((long)&p_Var7[1]._M_parent + 1) == '\0',
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16d,"false == i->second.restat_");
      testing::Test::Check
                (g_current_test,p_Var7[2]._M_left == p_Var7[2]._M_parent,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16e,"0u == i->second.implicit_outputs_.size()");
      testing::Test::Check
                (g_current_test,p_Var7[1]._M_right == p_Var7[1]._M_left,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16f,"0u == i->second.implicit_inputs_.size()");
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, NoImplicit) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"));

  EXPECT_EQ(1u, dyndep_file_.size());
  DyndepFile::iterator i = dyndep_file_.find(state_.edges_[0]);
  ASSERT_NE(i, dyndep_file_.end());
  EXPECT_EQ(false, i->second.restat_);
  EXPECT_EQ(0u, i->second.implicit_outputs_.size());
  EXPECT_EQ(0u, i->second.implicit_inputs_.size());
}